

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_storage_sequential.c
# Opt level: O2

log_policy_interface log_policy_storage_sequential_interface(void)

{
  return &log_policy_storage_sequential_interface::policy_interface_storage;
}

Assistant:

log_policy_interface log_policy_storage_sequential_interface(void)
{
	static struct log_policy_storage_impl_type log_policy_storage_sequential_impl_obj = {
		&log_policy_storage_sequential_append,
		&log_policy_storage_sequential_flush
	};

	static struct log_policy_interface_type policy_interface_storage = {
		&log_policy_storage_sequential_create,
		&log_policy_storage_sequential_impl_obj,
		&log_policy_storage_sequential_destroy
	};

	return &policy_interface_storage;
}